

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

bool __thiscall S2Polyline::FindValidationError(S2Polyline *this,S2Error *error)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  S2Point *pSVar4;
  BasicVector<Vector3,_double,_3UL> *pBVar5;
  D local_40;
  uint local_28;
  uint local_24;
  int i_1;
  int i;
  S2Error *error_local;
  S2Polyline *this_local;
  
  local_24 = 0;
  _i_1 = error;
  error_local = (S2Error *)this;
  while( true ) {
    uVar1 = local_24;
    iVar3 = num_vertices(this);
    if (iVar3 <= (int)uVar1) {
      local_28 = 1;
      while( true ) {
        uVar1 = local_28;
        iVar3 = num_vertices(this);
        if (iVar3 <= (int)uVar1) {
          return false;
        }
        pBVar5 = (BasicVector<Vector3,_double,_3UL> *)vertex(this,local_28 - 1);
        pSVar4 = vertex(this,local_28);
        bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          (pBVar5,pSVar4);
        if (bVar2) break;
        pBVar5 = (BasicVector<Vector3,_double,_3UL> *)vertex(this,local_28 - 1);
        pSVar4 = vertex(this,local_28);
        util::math::internal_vector::operator-(&local_40,pSVar4);
        bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          (pBVar5,&local_40);
        if (bVar2) {
          S2Error::Init(_i_1,ANTIPODAL_VERTICES,"Vertices %d and %d are antipodal",
                        (ulong)(local_28 - 1),(ulong)local_28);
          return true;
        }
        local_28 = local_28 + 1;
      }
      S2Error::Init(_i_1,DUPLICATE_VERTICES,"Vertices %d and %d are identical",(ulong)(local_28 - 1)
                    ,(ulong)local_28);
      return true;
    }
    pSVar4 = vertex(this,local_24);
    bVar2 = S2::IsUnitLength(pSVar4);
    if (!bVar2) break;
    local_24 = local_24 + 1;
  }
  S2Error::Init(_i_1,NOT_UNIT_LENGTH,"Vertex %d is not unit length",(ulong)local_24);
  return true;
}

Assistant:

bool S2Polyline::FindValidationError(S2Error* error) const {
  // All vertices must be unit length.
  for (int i = 0; i < num_vertices(); ++i) {
    if (!S2::IsUnitLength(vertex(i))) {
      error->Init(S2Error::NOT_UNIT_LENGTH, "Vertex %d is not unit length", i);
      return true;
    }
  }
  // Adjacent vertices must not be identical or antipodal.
  for (int i = 1; i < num_vertices(); ++i) {
    if (vertex(i - 1) == vertex(i)) {
      error->Init(S2Error::DUPLICATE_VERTICES,
                  "Vertices %d and %d are identical", i - 1, i);
      return true;
    }
    if (vertex(i - 1) == -vertex(i)) {
      error->Init(S2Error::ANTIPODAL_VERTICES,
                  "Vertices %d and %d are antipodal", i - 1, i);
      return true;
    }
  }
  return false;
}